

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acceln.cpp
# Opt level: O2

bool embree::AccelN::pointQuery(Intersectors *This_in,PointQuery *query,PointQueryContext *context)

{
  AccelData *pAVar1;
  long lVar2;
  byte bVar3;
  size_t i;
  ulong uVar4;
  byte bVar5;
  
  pAVar1 = This_in->ptr;
  bVar5 = 0;
  uVar4 = 0;
  while( true ) {
    lVar2 = *(long *)&pAVar1[3].type;
    if ((ulong)(*(long *)&pAVar1[3].field_0x58 - lVar2 >> 3) <= uVar4) break;
    lVar2 = *(long *)(lVar2 + uVar4 * 8);
    if (*(float *)(lVar2 + 0x10) < INFINITY) {
      bVar3 = (**(code **)(lVar2 + 0x88))(lVar2 + 0x58,query,context);
      bVar5 = bVar5 | bVar3;
    }
    uVar4 = uVar4 + 1;
  }
  return (bool)(bVar5 & 1);
}

Assistant:

bool AccelN::pointQuery (Accel::Intersectors* This_in, PointQuery* query, PointQueryContext* context)
  {
    bool changed = false;
    AccelN* This = (AccelN*)This_in->ptr;
    for (size_t i=0; i<This->accels.size(); i++)
      if (!This->accels[i]->isEmpty())
        changed |= This->accels[i]->intersectors.pointQuery(query,context);
    return changed;
  }